

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

bool __thiscall DListMenu::MenuEvent(DListMenu *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FListMenuDescriptor *pFVar4;
  uint uVar5;
  uint uVar6;
  FSoundID *sound_id;
  FSoundID local_2c [3];
  
  pFVar4 = this->mDesc;
  uVar1 = pFVar4->mSelectedItem;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  uVar5 = uVar1;
  if (mkey == 0) {
    do {
      iVar3 = uVar5 - 1;
      pFVar4->mSelectedItem = iVar3;
      if ((int)uVar5 < 1) {
        iVar3 = (pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count - 1;
        pFVar4->mSelectedItem = iVar3;
      }
      iVar3 = (*(pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[iVar3]->
                _vptr_FListMenuItem[5])();
      pFVar4 = this->mDesc;
      uVar5 = pFVar4->mSelectedItem;
      if ((char)iVar3 != '\0') {
        if (uVar5 != uVar6) goto LAB_0032c7f0;
        break;
      }
    } while (uVar5 != uVar6);
    pFVar4->mSelectedItem = uVar1;
LAB_0032c7f0:
    iVar3 = S_FindSound("menu/cursor");
    sound_id = local_2c + 2;
  }
  else if (mkey == 6) {
    if ((int)uVar1 < 0) {
      return true;
    }
    iVar3 = (*(pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar1]->
              _vptr_FListMenuItem[6])();
    if ((char)iVar3 == '\0') {
      return true;
    }
    iVar3 = S_FindSound("menu/choose");
    sound_id = local_2c;
  }
  else {
    if (mkey != 1) {
      bVar2 = DMenu::MenuEvent(&this->super_DMenu,mkey,fromcontroller);
      return bVar2;
    }
    do {
      iVar3 = uVar5 + 1;
      if ((int)(pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count <=
          (int)(uVar5 + 1)) {
        iVar3 = 0;
      }
      pFVar4->mSelectedItem = iVar3;
      iVar3 = (*(pFVar4->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[iVar3]->
                _vptr_FListMenuItem[5])();
      pFVar4 = this->mDesc;
      uVar5 = pFVar4->mSelectedItem;
      if ((char)iVar3 != '\0') {
        if (uVar5 != uVar6) goto LAB_0032c80b;
        break;
      }
    } while (uVar5 != uVar6);
    pFVar4->mSelectedItem = uVar1;
LAB_0032c80b:
    iVar3 = S_FindSound("menu/cursor");
    sound_id = local_2c + 1;
  }
  sound_id->ID = iVar3;
  S_Sound(0x22,sound_id,snd_menuvolume.Value,0.0);
  return true;
}

Assistant:

bool DListMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int oldSelect = mDesc->mSelectedItem;
	int startedAt = mDesc->mSelectedItem;
	if (startedAt < 0) startedAt = 0;

	switch (mkey)
	{
	case MKEY_Up:
		do
		{
			if (--mDesc->mSelectedItem < 0) mDesc->mSelectedItem = mDesc->mItems.Size()-1;
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		if (mDesc->mSelectedItem == startedAt) mDesc->mSelectedItem = oldSelect;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		return true;

	case MKEY_Down:
		do
		{
			if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size()) mDesc->mSelectedItem = 0;
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		if (mDesc->mSelectedItem == startedAt) mDesc->mSelectedItem = oldSelect;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		return true;

	case MKEY_Enter:
		if (mDesc->mSelectedItem >= 0 && mDesc->mItems[mDesc->mSelectedItem]->Activate())
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		}
		return true;

	default:
		return Super::MenuEvent(mkey, fromcontroller);
	}
}